

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O1

FloatFormat * tcu::FloatFormat::nativeFloat(void)

{
  double dVar1;
  double dVar2;
  FloatFormat *in_RDI;
  
  in_RDI->m_minExp = -0x7e;
  in_RDI->m_maxExp = 0x7f;
  in_RDI->m_fractionBits = 0x17;
  in_RDI->m_hasSubnormal = YES;
  in_RDI->m_hasInf = YES;
  in_RDI->m_hasNaN = YES;
  in_RDI->m_exactPrecision = true;
  dVar1 = ldexp(1.0,0x7f);
  dVar2 = ldexp(8388607.0,0x68);
  in_RDI->m_maxValue = dVar2 + dVar1;
  return in_RDI;
}

Assistant:

FloatFormat	FloatFormat::nativeFloat (void)
{
	return nativeFormat<float>();
}